

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O1

void __thiscall cmInstallExportGenerator::ComputeTempDir(cmInstallExportGenerator *this)

{
  string *input;
  string *psVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  pointer pbVar3;
  pointer pcVar4;
  ulong uVar5;
  ulong uVar6;
  size_type sVar7;
  const_iterator __begin2;
  pointer pbVar8;
  string dest;
  string local_38;
  
  cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  psVar1 = &this->TempDir;
  std::__cxx11::string::_M_assign((string *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  if ((this->super_cmInstallGenerator).Destination._M_string_length != 0) {
    std::__cxx11::string::append((char *)psVar1);
    pvVar2 = (this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes;
    pbVar8 = (pvVar2->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (pvVar2->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar8 == pbVar3) {
      uVar5 = (this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName.
              _M_string_length;
      uVar6 = 8;
      if (8 < uVar5) {
        uVar6 = uVar5;
      }
    }
    else {
      uVar6 = 8;
      do {
        if (uVar6 < pbVar8->_M_string_length) {
          uVar6 = pbVar8->_M_string_length;
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar3);
    }
    input = &(this->super_cmInstallGenerator).Destination;
    uVar5 = (this->TempDir)._M_string_length + (this->FileName)._M_string_length + uVar6 + 2;
    if ((uVar5 < 1000) &&
       (uVar6 = (this->super_cmInstallGenerator).Destination._M_string_length, uVar6 <= 1000 - uVar5
       )) {
      pcVar4 = (input->_M_dataplus)._M_p;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_38,pcVar4,pcVar4 + uVar6);
      if (*local_38._M_dataplus._M_p == '/') {
        *local_38._M_dataplus._M_p = '_';
      }
      if (local_38._M_string_length != 0) {
        sVar7 = 0;
        do {
          if (local_38._M_dataplus._M_p[sVar7] == ':') {
            local_38._M_dataplus._M_p[sVar7] = '_';
          }
          sVar7 = sVar7 + 1;
        } while (local_38._M_string_length != sVar7);
      }
      cmsys::SystemTools::ReplaceString(&local_38,"../","__/");
      if (local_38._M_string_length != 0) {
        sVar7 = 0;
        do {
          if (local_38._M_dataplus._M_p[sVar7] == ' ') {
            local_38._M_dataplus._M_p[sVar7] = '_';
          }
          sVar7 = sVar7 + 1;
        } while (local_38._M_string_length != sVar7);
      }
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_38._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return;
      }
    }
    else {
      cmSystemTools::ComputeStringMD5(&local_38,input);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_38._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return;
      }
    }
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::ComputeTempDir()
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  this->TempDir = this->LocalGenerator->GetCurrentBinaryDirectory();
  this->TempDir += "/CMakeFiles";
  this->TempDir += "/Export";
  if (this->Destination.empty()) {
    return;
  }
  this->TempDir += "/";

  // Enforce a maximum length.
  bool useMD5 = false;
#if defined(_WIN32) || defined(__CYGWIN__)
  std::string::size_type const max_total_len = 250;
#else
  std::string::size_type const max_total_len = 1000;
#endif
  // Will generate files of the form "<temp-dir>/<base>-<config>.<ext>".
  std::string::size_type const len = this->TempDir.size() + 1 +
    this->FileName.size() + 1 + this->GetMaxConfigLength();
  if (len < max_total_len) {
    // Keep the total path length below the limit.
    std::string::size_type const max_len = max_total_len - len;
    if (this->Destination.size() > max_len) {
      useMD5 = true;
    }
  } else {
    useMD5 = true;
  }
  if (useMD5) {
    // Replace the destination path with a hash to keep it short.
    this->TempDir += cmSystemTools::ComputeStringMD5(this->Destination);
  } else {
    std::string dest = this->Destination;
    // Avoid unix full paths.
    if (dest[0] == '/') {
      dest[0] = '_';
    }
    // Avoid windows full paths by removing colons.
    std::replace(dest.begin(), dest.end(), ':', '_');
    // Avoid relative paths that go up the tree.
    cmSystemTools::ReplaceString(dest, "../", "__/");
    // Avoid spaces.
    std::replace(dest.begin(), dest.end(), ' ', '_');
    this->TempDir += dest;
  }
}